

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_scan_sse41_128_64.c
# Opt level: O2

parasail_result_t *
parasail_sg_flags_rowcol_scan_profile_sse41_128_64
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap,int s1_beg,int s1_end,
          int s2_beg,int s2_end)

{
  long *plVar1;
  undefined4 *puVar2;
  uint uVar3;
  void *pvVar4;
  parasail_matrix_t *ppVar5;
  int *piVar6;
  undefined1 auVar7 [16];
  undefined4 uVar8;
  undefined1 auVar9 [16];
  uint uVar10;
  longlong lVar11;
  int iVar12;
  parasail_result_t *ppVar13;
  __m128i *ptr;
  int64_t *ptr_00;
  __m128i *ptr_01;
  __m128i *ptr_02;
  __m128i *ptr_03;
  __m128i *palVar14;
  __m128i *palVar15;
  uint uVar16;
  char *pcVar17;
  long lVar20;
  int iVar18;
  uint uVar19;
  ulong uVar21;
  uint uVar22;
  uint uVar23;
  ulong size;
  ulong uVar24;
  __m128i *palVar25;
  char *__format;
  long lVar26;
  ulong uVar27;
  long lVar28;
  long lVar29;
  __m128i *palVar30;
  int iVar31;
  longlong lVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 extraout_XMM0 [16];
  undefined1 auVar42 [16];
  __m128i alVar43;
  longlong lVar44;
  undefined1 extraout_XMM0_00 [16];
  __m128i_64_t B;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  __m128i_64_t B_1;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  __m128i_64_t B_4;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  __m128i_64_t B_2;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  ulong uVar60;
  ulong uVar61;
  int64_t iVar62;
  __m128i_64_t B_3;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  __m128i a;
  __m128i a_00;
  __m128i b;
  __m128i b_00;
  int local_17c;
  ulong local_148;
  undefined8 uStack_140;
  long local_138;
  long lStack_130;
  undefined4 local_128;
  undefined4 uStack_124;
  undefined1 local_f8 [16];
  __m128i_64_t e;
  __m128i_64_t h;
  
  if (profile == (parasail_profile_t *)0x0) {
    __format = "%s: missing %s\n";
    pcVar17 = "profile";
  }
  else {
    pvVar4 = (profile->profile64).score;
    if (pvVar4 == (void *)0x0) {
      __format = "%s: missing %s\n";
      pcVar17 = "profile->profile64.score";
    }
    else {
      ppVar5 = profile->matrix;
      if (ppVar5 == (parasail_matrix_t *)0x0) {
        __format = "%s: missing %s\n";
        pcVar17 = "profile->matrix";
      }
      else {
        uVar3 = profile->s1Len;
        if ((int)uVar3 < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar17 = "profile->s1Len";
        }
        else if (s2 == (char *)0x0) {
          __format = "%s: missing %s\n";
          pcVar17 = "s2";
        }
        else if (s2Len < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar17 = "s2Len";
        }
        else if (open < 0) {
          __format = "%s: %s must be >= 0\n";
          pcVar17 = "open";
        }
        else {
          if (-1 < gap) {
            uVar22 = uVar3 - 1;
            size = (ulong)uVar3 + 1 >> 1;
            uVar23 = -open;
            uVar16 = ppVar5->min;
            local_148 = 0x8000000000000000 - (long)(int)uVar16;
            if (uVar16 != uVar23 && SBORROW4(uVar16,uVar23) == (int)(uVar16 + open) < 0) {
              local_148 = (ulong)(uint)open | 0x8000000000000000;
            }
            iVar18 = ppVar5->max;
            ppVar13 = parasail_result_new_rowcol1((uint)((ulong)uVar3 + 1) & 0x7ffffffe,s2Len);
            if (ppVar13 != (parasail_result_t *)0x0) {
              ppVar13->flag =
                   (uint)(s1_end != 0) * 0x10 + (uint)(s1_beg != 0) * 8 | (uint)(s2_beg != 0) << 0xe
                   | (uint)(s2_end != 0) << 0xf | ppVar13->flag | 0x2840402;
              ptr = parasail_memalign___m128i(0x10,size);
              ptr_00 = parasail_memalign_int64_t(0x10,(ulong)(s2Len + 1));
              ptr_01 = parasail_memalign___m128i(0x10,size);
              ptr_02 = parasail_memalign___m128i(0x10,size);
              ptr_03 = parasail_memalign___m128i(0x10,size);
              if (ptr_03 != (__m128i *)0x0 &&
                  ((ptr_02 != (__m128i *)0x0 && ptr_01 != (__m128i *)0x0) &&
                  (ptr_00 != (int64_t *)0x0 && ptr != (__m128i *)0x0))) {
                iVar12 = s2Len + -1;
                iVar31 = 1 - (int)(uVar22 / size);
                uVar60 = (ulong)(uint)open;
                uVar61 = (ulong)(uint)gap;
                palVar14 = (__m128i *)(local_148 + 1);
                lVar20 = 0x7ffffffffffffffe - (long)iVar18;
                auVar47._8_4_ = (int)palVar14;
                auVar47._0_8_ = palVar14;
                auVar47._12_4_ = (int)((ulong)palVar14 >> 0x20);
                auVar48._8_4_ = (int)lVar20;
                auVar48._0_8_ = lVar20;
                auVar48._12_4_ = (int)((ulong)lVar20 >> 0x20);
                auVar45._0_8_ = (long)iVar31;
                auVar45._8_4_ = iVar31;
                auVar45._12_4_ = iVar31 >> 0x1f;
                lVar20 = (long)(int)uVar23;
                for (uVar24 = 0; uVar24 != size; uVar24 = uVar24 + 1) {
                  lVar26 = lVar20;
                  for (lVar28 = 0; lVar28 != 2; lVar28 = lVar28 + 1) {
                    lVar29 = lVar26;
                    if (s1_beg != 0) {
                      lVar29 = 0;
                    }
                    *(long *)((long)&h + lVar28 * 8) = lVar29;
                    *(ulong *)((long)&e + lVar28 * 8) = lVar29 - (ulong)(uint)open;
                    lVar26 = lVar26 - size * (uint)gap;
                  }
                  ptr_02[uVar24][0] = h.m[0];
                  ptr_02[uVar24][1] = h.m[1];
                  ptr[uVar24][0] = e.m[0];
                  ptr[uVar24][1] = e.m[1];
                  lVar20 = lVar20 - (ulong)(uint)gap;
                }
                *ptr_00 = 0;
                for (uVar24 = 1; uVar27 = (ulong)uVar23, s2Len + 1 != uVar24; uVar24 = uVar24 + 1) {
                  uVar16 = 0;
                  if (s2_beg == 0) {
                    uVar16 = uVar23;
                  }
                  ptr_00[uVar24] = (long)(int)uVar16;
                  uVar23 = uVar23 - gap;
                }
                alVar43[1] = -(ulong)(uint)open;
                alVar43[0] = -uVar60;
                uVar16 = (uint)size;
                for (uVar23 = uVar16 - 1; -1 < (int)uVar23; uVar23 = uVar23 - 1) {
                  ptr_03[uVar23] = alVar43;
                  lVar20 = alVar43[1];
                  alVar43[0] = alVar43[0] - uVar61;
                  alVar43[1] = lVar20 - (ulong)(uint)gap;
                  auVar52._0_8_ = -(ulong)(auVar48._0_8_ < alVar43[0]);
                  auVar52._8_8_ = -(ulong)(auVar48._8_8_ < alVar43[1]);
                  auVar48 = blendvpd((undefined1  [16])alVar43,auVar48,auVar52);
                }
                palVar25 = ptr_02 + (uVar16 - 1);
                palVar15 = ptr_02 + (ulong)uVar22 % size;
                local_f8._8_8_ = auVar45._8_8_;
                local_f8._8_8_ = -(ulong)(local_f8._8_8_ == 0);
                local_f8._0_8_ = -(ulong)(auVar45._0_8_ == 1);
                uVar24 = 0;
                auVar45 = auVar47;
                auVar52 = auVar47;
                local_17c = iVar12;
                while (uVar21 = uVar24, uVar21 != (uint)s2Len) {
                  auVar59._8_4_ = (int)(*palVar25)[0];
                  auVar59._0_8_ = (*palVar25)[0];
                  auVar59._12_4_ = *(undefined4 *)((long)*palVar25 + 4);
                  iVar18 = ppVar5->mapper[(byte)s2[uVar21]];
                  auVar64._0_8_ = (long)palVar14 - (*ptr_03)[0];
                  auVar64._8_8_ = auVar47._8_8_ - (*ptr_03)[1];
                  lVar26 = 0;
                  auVar54 = auVar47;
                  iVar62 = ptr_00[uVar21];
                  lVar20 = auVar59._8_8_;
                  while( true ) {
                    b[1] = auVar54._0_8_;
                    if (size << 4 == lVar26) break;
                    plVar1 = (long *)((long)*ptr_02 + lVar26);
                    lVar28 = *plVar1;
                    lVar29 = plVar1[1];
                    plVar1 = (long *)((long)*ptr + lVar26);
                    auVar55._0_8_ = *plVar1 - uVar61;
                    auVar55._8_8_ = plVar1[1] - (ulong)(uint)gap;
                    plVar1 = (long *)((long)pvVar4 + lVar26 + (long)(int)(iVar18 * uVar16) * 0x10);
                    auVar63._0_8_ = iVar62 + *plVar1;
                    auVar63._8_8_ = lVar20 + plVar1[1];
                    plVar1 = (long *)((long)*ptr_03 + lVar26);
                    auVar53._0_8_ = auVar64._0_8_ + *plVar1;
                    auVar53._8_8_ = auVar64._8_8_ + plVar1[1];
                    auVar58._0_8_ = lVar28 - uVar60;
                    auVar58._8_8_ = lVar29 - (ulong)(uint)open;
                    auVar33._0_8_ = -(ulong)(auVar53._0_8_ < b[1]);
                    auVar33._8_8_ = -(ulong)(auVar53._8_8_ < auVar54._8_8_);
                    auVar54 = blendvpd(auVar53,auVar54,auVar33);
                    auVar34._0_8_ = -(ulong)(auVar58._0_8_ < auVar55._0_8_);
                    auVar34._8_8_ = -(ulong)(auVar58._8_8_ < auVar55._8_8_);
                    auVar59 = blendvpd(auVar58,auVar55,auVar34);
                    auVar35._0_8_ = -(ulong)(auVar63._0_8_ < auVar59._0_8_);
                    auVar35._8_8_ = -(ulong)(auVar63._8_8_ < auVar59._8_8_);
                    auVar64 = blendvpd(auVar63,auVar59,auVar35);
                    *(undefined1 (*) [16])((long)*ptr + lVar26) = auVar59;
                    *(undefined1 (*) [16])((long)*ptr_01 + lVar26) = auVar64;
                    lVar26 = lVar26 + 0x10;
                    iVar62 = lVar28;
                    lVar20 = lVar29;
                  }
                  auVar54._8_4_ = auVar64._0_4_;
                  auVar54._0_8_ = auVar64._0_8_;
                  auVar54._12_4_ = auVar64._4_4_;
                  lVar20 = ptr_00[uVar21 + 1];
                  auVar51._8_8_ = auVar54._8_8_;
                  auVar51._0_8_ = lVar20;
                  lVar26 = lVar20 + (*ptr_03)[0];
                  if (lVar26 < b[1]) {
                    lVar26 = b[1];
                  }
                  auVar57._8_8_ = lVar26;
                  auVar57._0_8_ = palVar14;
                  auVar36._0_8_ = -(ulong)((long)palVar14 < lVar20);
                  auVar36._8_8_ = -(ulong)(lVar26 < auVar51._8_8_);
                  auVar54 = blendvpd(auVar57,auVar51,auVar36);
                  for (lVar20 = 0; size << 4 != lVar20; lVar20 = lVar20 + 0x10) {
                    auVar49._0_8_ = auVar57._0_8_ - uVar61;
                    auVar49._8_8_ = auVar57._8_8_ - (ulong)(uint)gap;
                    auVar56._0_8_ = auVar54._0_8_ - uVar60;
                    auVar56._8_8_ = auVar54._8_8_ - (ulong)(uint)open;
                    auVar37._0_8_ = -(ulong)(auVar56._0_8_ < auVar49._0_8_);
                    auVar37._8_8_ = -(ulong)(auVar56._8_8_ < auVar49._8_8_);
                    auVar57 = blendvpd(auVar56,auVar49,auVar37);
                    auVar54 = *(undefined1 (*) [16])((long)*ptr_01 + lVar20);
                    auVar38._0_8_ = -(ulong)(auVar57._0_8_ < auVar54._0_8_);
                    auVar38._8_8_ = -(ulong)(auVar57._8_8_ < auVar54._8_8_);
                    auVar54 = blendvpd(auVar57,auVar54,auVar38);
                    *(undefined1 (*) [16])((long)*ptr_02 + lVar20) = auVar54;
                    auVar39._0_8_ = -(ulong)(auVar48._0_8_ < auVar54._0_8_);
                    auVar39._8_8_ = -(ulong)(auVar48._8_8_ < auVar54._8_8_);
                    auVar48 = blendvpd(auVar54,auVar48,auVar39);
                    auVar40._0_8_ = -(ulong)(auVar48._0_8_ < auVar57._0_8_);
                    auVar40._8_8_ = -(ulong)(auVar48._8_8_ < auVar57._8_8_);
                    auVar48 = blendvpd(auVar57,auVar48,auVar40);
                    auVar41._0_8_ = -(ulong)(auVar54._0_8_ < auVar52._0_8_);
                    auVar41._8_8_ = -(ulong)(auVar54._8_8_ < auVar52._8_8_);
                    auVar52 = blendvpd(auVar54,auVar52,auVar41);
                  }
                  lVar20 = (*palVar15)[0];
                  lVar26 = (*palVar15)[1];
                  alVar43 = *palVar15;
                  a[1] = (longlong)ptr_03;
                  a[0] = uVar27;
                  b[0] = uVar21;
                  _mm_cmpgt_epi64_rpl(a,b);
                  auVar54 = extraout_XMM0 & local_f8;
                  auVar42._0_8_ = -(ulong)(auVar45._0_8_ < lVar20);
                  auVar42._8_8_ = -(ulong)(auVar45._8_8_ < lVar26);
                  auVar45 = blendvpd(auVar45,(undefined1  [16])alVar43,auVar42);
                  iVar18 = 0;
                  while (iVar18 < iVar31) {
                    auVar9._8_8_ = 0;
                    auVar9._0_8_ = alVar43[0];
                    alVar43 = (__m128i)(auVar9 << 0x40);
                    iVar18 = 1;
                  }
                  ((ppVar13->field_4).rowcols)->score_row[uVar21] = (int)alVar43[1];
                  uVar24 = uVar21 + 1;
                  if ((((((((((((((((auVar54 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0
                                   || (auVar54 >> 0xf & (undefined1  [16])0x1) !=
                                      (undefined1  [16])0x0) ||
                                  (auVar54 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0
                                  ) || (auVar54 >> 0x1f & (undefined1  [16])0x1) !=
                                       (undefined1  [16])0x0) ||
                                (auVar54 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                               || (auVar54 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0
                               ) || (auVar54 >> 0x37 & (undefined1  [16])0x1) !=
                                    (undefined1  [16])0x0) ||
                             (auVar54 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (auVar54 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                           (auVar54 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar54 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar54 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar54 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar54 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar54 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      auVar54[0xf] < '\0') {
                    local_17c = (int)uVar21;
                  }
                }
                for (uVar24 = 0; size * 4 != uVar24; uVar24 = uVar24 + 4) {
                  puVar2 = (undefined4 *)((long)*ptr_02 + uVar24 * 4);
                  uVar8 = puVar2[2];
                  piVar6 = ((ppVar13->field_4).rowcols)->score_col;
                  *(undefined4 *)((long)piVar6 + uVar24) = *puVar2;
                  uVar21 = (long)piVar6 + uVar24;
                  *(undefined4 *)(size * 4 + uVar21) = uVar8;
                }
                if (s2_end != 0) {
                  uVar24 = 0;
                  while( true ) {
                    palVar14 = auVar45._8_8_;
                    if (iVar31 <= (int)uVar24) break;
                    auVar7._8_8_ = 0;
                    auVar7._0_8_ = auVar45._0_8_;
                    auVar45 = auVar7 << 0x40;
                    uVar24 = 1;
                  }
                }
                palVar25 = ptr_03;
                uVar23 = uVar22;
                if (s1_end != 0) {
                  for (uVar24 = 0; (uVar16 & 0x3fffffff) * 2 != (int)uVar24; uVar24 = uVar24 + 1) {
                    palVar25 = (__m128i *)(uVar24 >> 1 & 0x7fffffff);
                    uVar19 = 0;
                    if ((uVar24 & 1) != 0) {
                      uVar19 = uVar16;
                    }
                    uVar19 = uVar19 + (int)palVar25;
                    uVar21 = (ulong)uVar19;
                    palVar30 = palVar14;
                    uVar10 = uVar23;
                    iVar18 = local_17c;
                    if (((int)uVar19 < (int)uVar3) &&
                       (palVar25 = (__m128i *)(*ptr_02)[uVar24], palVar30 = palVar25,
                       uVar10 = uVar19, iVar18 = iVar12, (long)palVar25 <= (long)palVar14)) {
                      if ((int)uVar23 <= (int)uVar19) {
                        uVar21 = (ulong)uVar23;
                      }
                      if (local_17c != iVar12) {
                        uVar21 = (ulong)uVar23;
                      }
                      palVar30 = palVar14;
                      uVar10 = uVar23;
                      iVar18 = local_17c;
                      if (palVar25 == palVar14) {
                        uVar10 = (uint)uVar21;
                      }
                    }
                    local_17c = iVar18;
                    uVar23 = uVar10;
                    palVar14 = palVar30;
                  }
                }
                iVar18 = (int)palVar14;
                a_00[0] = (ulong)(uint)(s2_end | s1_end);
                if ((s2_end | s1_end) == 0) {
                  uVar24 = 0;
                  lVar11 = (*palVar15)[0];
                  lVar44 = (*palVar15)[1];
                  while (lVar32 = lVar11, (int)uVar24 < iVar31) {
                    lVar11 = 0;
                    lVar44 = lVar32;
                    uVar24 = 1;
                  }
                  iVar18 = (int)lVar44;
                  uVar23 = uVar22;
                  local_17c = iVar12;
                }
                local_128 = (undefined4)local_148;
                uStack_124 = (undefined4)(local_148 >> 0x20);
                uStack_140._0_4_ = local_128;
                uStack_140._4_4_ = uStack_124;
                a_00[1] = (longlong)palVar25;
                b_00[1] = uVar24;
                b_00[0] = uVar21;
                _mm_cmpgt_epi64_rpl(a_00,b_00);
                local_138 = auVar48._0_8_;
                lStack_130 = auVar48._8_8_;
                auVar50._0_8_ = -(ulong)((long)local_148 < local_138);
                auVar50._8_8_ = -(ulong)(uStack_140 < lStack_130);
                auVar46._8_4_ = 0xffffffff;
                auVar46._0_8_ = 0xffffffffffffffff;
                auVar46._12_4_ = 0xffffffff;
                auVar47 = auVar46 ^ auVar50 | extraout_XMM0_00;
                if ((((((((((((((((auVar47 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                                 (auVar47 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                                || (auVar47 >> 0x17 & (undefined1  [16])0x1) !=
                                   (undefined1  [16])0x0) ||
                               (auVar47 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                              || (auVar47 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                             || (auVar47 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                            || (auVar47 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                           || (auVar47 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar47 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar47 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar47 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar47 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar47 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar47 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar47 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar47[0xf] < '\0') {
                  *(byte *)&ppVar13->flag = (byte)ppVar13->flag | 0x40;
                  iVar18 = 0;
                  local_17c = 0;
                  uVar23 = 0;
                }
                ppVar13->score = iVar18;
                ppVar13->end_query = uVar23;
                ppVar13->end_ref = local_17c;
                parasail_free(ptr_03);
                parasail_free(ptr_02);
                parasail_free(ptr_01);
                parasail_free(ptr_00);
                parasail_free(ptr);
                return ppVar13;
              }
            }
            return (parasail_result_t *)0x0;
          }
          __format = "%s: %s must be >= 0\n";
          pcVar17 = "gap";
        }
      }
    }
  }
  fprintf(_stderr,__format,"parasail_sg_flags_rowcol_scan_profile_sse41_128_64",pcVar17);
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t s1Len = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict pvP = NULL;
    __m128i* restrict pvE = NULL;
    int64_t* restrict boundary = NULL;
    __m128i* restrict pvHt = NULL;
    __m128i* restrict pvH = NULL;
    __m128i* restrict pvGapper = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int64_t NEG_LIMIT = 0;
    int64_t POS_LIMIT = 0;
    __m128i vZero;
    int64_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vMaxH;
    __m128i vPosMask;
    __m128i vNegInfFront;
    __m128i vSegLenXgap;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile64.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 2; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    pvP = (__m128i*)profile->profile64.score;
    vGapO = _mm_set1_epi64x_rpl(open);
    vGapE = _mm_set1_epi64x_rpl(gap);
    NEG_LIMIT = (-open < matrix->min ? INT64_MIN + open : INT64_MIN - matrix->min) + 1;
    POS_LIMIT = INT64_MAX - matrix->max - 1;
    vZero = _mm_setzero_si128();
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi64x_rpl(NEG_LIMIT);
    vPosLimit = _mm_set1_epi64x_rpl(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vPosMask = _mm_cmpeq_epi64(_mm_set1_epi64x_rpl(position),
            _mm_set_epi64x_rpl(0,1));
    vNegInfFront = vZero;
    vNegInfFront = _mm_insert_epi64_rpl(vNegInfFront, NEG_LIMIT, 0);
    vSegLenXgap = _mm_add_epi64(vNegInfFront,
            _mm_slli_si128(_mm_set1_epi64x_rpl(-segLen*gap), 8));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_SCAN
        | PARASAIL_FLAG_BITS_64 | PARASAIL_FLAG_LANES_2;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvE = parasail_memalign___m128i(16, segLen);
    boundary = parasail_memalign_int64_t(16, s2Len+1);
    pvHt= parasail_memalign___m128i(16, segLen);
    pvH = parasail_memalign___m128i(16, segLen);
    pvGapper = parasail_memalign___m128i(16, segLen);

    /* validate heap variables */
    if (!pvE) return NULL;
    if (!boundary) return NULL;
    if (!pvHt) return NULL;
    if (!pvH) return NULL;
    if (!pvGapper) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_64_t h;
            __m128i_64_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = s1_beg ? 0 : (-open-gap*(segNum*segLen+i));
                h.v[segNum] = tmp < INT64_MIN ? INT64_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT64_MIN ? INT64_MIN : tmp;
            }
            _mm_store_si128(&pvH[index], h.m);
            _mm_store_si128(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = s2_beg ? 0 : (-open-gap*(i-1));
            boundary[i] = tmp < INT64_MIN ? INT64_MIN : tmp;
        }
    }

    {
        __m128i vGapper = _mm_sub_epi64(vZero,vGapO);
        for (i=segLen-1; i>=0; --i) {
            _mm_store_si128(pvGapper+i, vGapper);
            vGapper = _mm_sub_epi64(vGapper, vGapE);
            /* long queries and/or large penalties will break the pseudo prefix scan */
            vSaturationCheckMin = _mm_min_epi64_rpl(vSaturationCheckMin, vGapper);
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        __m128i vHt;
        __m128i vF;
        __m128i vH;
        __m128i vHp;
        __m128i *pvW;
        __m128i vW;

        /* calculate E */
        /* calculate Ht */
        /* calculate F and H first pass */
        vHp = _mm_load_si128(pvH+(segLen-1));
        vHp = _mm_slli_si128(vHp, 8);
        vHp = _mm_insert_epi64_rpl(vHp, boundary[j], 0);
        pvW = pvP + matrix->mapper[(unsigned char)s2[j]]*segLen;
        vHt = _mm_sub_epi64(vNegLimit, pvGapper[0]);
        vF = vNegLimit;
        for (i=0; i<segLen; ++i) {
            vH = _mm_load_si128(pvH+i);
            vE = _mm_load_si128(pvE+i);
            vW = _mm_load_si128(pvW+i);
            vE = _mm_max_epi64_rpl(
                    _mm_sub_epi64(vE, vGapE),
                    _mm_sub_epi64(vH, vGapO));
            vHp = _mm_add_epi64(vHp, vW);
            vF = _mm_max_epi64_rpl(vF, _mm_add_epi64(vHt, pvGapper[i]));
            vHt = _mm_max_epi64_rpl(vE, vHp);
            _mm_store_si128(pvE+i, vE);
            _mm_store_si128(pvHt+i, vHt);
            vHp = vH;
        }

        /* pseudo prefix scan on F and H */
        vHt = _mm_slli_si128(vHt, 8);
        vHt = _mm_insert_epi64_rpl(vHt, boundary[j+1], 0);
        vF = _mm_max_epi64_rpl(vF, _mm_add_epi64(vHt, pvGapper[0]));
        for (i=0; i<segWidth-2; ++i) {
            __m128i vFt = _mm_slli_si128(vF, 8);
            vFt = _mm_add_epi64(vFt, vSegLenXgap);
            vF = _mm_max_epi64_rpl(vF, vFt);
        }

        /* calculate final H */
        vF = _mm_slli_si128(vF, 8);
        vF = _mm_add_epi64(vF, vNegInfFront);
        vH = _mm_max_epi64_rpl(vHt, vF);
        for (i=0; i<segLen; ++i) {
            vHt = _mm_load_si128(pvHt+i);
            vF = _mm_max_epi64_rpl(
                    _mm_sub_epi64(vF, vGapE),
                    _mm_sub_epi64(vH, vGapO));
            vH = _mm_max_epi64_rpl(vHt, vF);
            _mm_store_si128(pvH+i, vH);
            vSaturationCheckMin = _mm_min_epi64_rpl(vSaturationCheckMin, vH);
            vSaturationCheckMin = _mm_min_epi64_rpl(vSaturationCheckMin, vF);
            vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
        } 

        /* extract vector containing last value from column */
        {
            __m128i vCompare;
            vH = _mm_load_si128(pvH + offset);
            vCompare = _mm_and_si128(vPosMask, _mm_cmpgt_epi64_rpl(vH, vMaxH));
            vMaxH = _mm_max_epi64_rpl(vH, vMaxH);
            if (_mm_movemask_epi8(vCompare)) {
                end_ref = j;
            }
#ifdef PARASAIL_ROWCOL
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 8);
            }
            result->rowcols->score_row[j] = (int64_t) _mm_extract_epi64_rpl (vH, 1);
#endif
        }
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvH + i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    /* max last value from all columns */
    if (s2_end)
    {
        for (k=0; k<position; ++k) {
            vMaxH = _mm_slli_si128(vMaxH, 8);
        }
        score = (int64_t) _mm_extract_epi64_rpl(vMaxH, 1);
        end_query = s1Len-1;
    }

    /* max of last column */
    if (s1_end)
    {
        /* Trace the alignment ending position on read. */
        int64_t *t = (int64_t*)pvH;
        int32_t column_len = segLen * segWidth;
        for (i = 0; i<column_len; ++i, ++t) {
            int32_t temp = i / segWidth + i % segWidth * segLen;
            if (temp >= s1Len) continue;
            if (*t > score) {
                score = *t;
                end_query = temp;
                end_ref = s2Len-1;
            }
            else if (*t == score && end_ref == s2Len-1 && temp < end_query) {
                end_query = temp;
            }
        }
    }

    if (!s1_end && !s2_end) {
        /* extract last value from the last column */
        {
            __m128i vH = _mm_load_si128(pvH + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 8);
            }
            score = (int64_t) _mm_extract_epi64_rpl (vH, 1);
            end_ref = s2Len - 1;
            end_query = s1Len - 1;
        }
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi64_rpl(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi64_rpl(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(pvGapper);
    parasail_free(pvH);
    parasail_free(pvHt);
    parasail_free(boundary);
    parasail_free(pvE);

    return result;
}